

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<unsigned_long_long,QWidget*>::emplace<QWidget*const&>
          (QHash<unsigned_long_long,QWidget*> *this,unsigned_long_long *key,QWidget **args)

{
  Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<unsigned_long_long,_QWidget_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *)0x0;
LAB_00316b61:
    pDVar1 = (Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *)0x0;
LAB_00316b82:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> **)this = pDVar1;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < *(ulong *)&pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QWidget*const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar2 = (piter)emplace_helper<QWidget*>(this,key,(QWidget **)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_00316bea;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar1 = *(Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> **)this;
      if (pDVar1 == (Data<QHashPrivate::Node<unsigned_long_long,_QWidget_*>_> *)0x0)
      goto LAB_00316b61;
    }
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_00316b82;
  }
  pVar2 = (piter)emplace_helper<QWidget*const&>(this,key,args);
  QHash<unsigned_long_long,_QWidget_*>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_00316bea:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }